

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

int XMLSearch_free(XMLSearch *search,int free_next)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0;
  if ((search != (XMLSearch *)0x0) && (iVar1 = 0, search->init_value == 0x19770522)) {
    if (search->tag != (SXML_CHAR *)0x0) {
      free(search->tag);
      search->tag = (SXML_CHAR *)0x0;
    }
    if (search->attributes != (XMLAttribute *)0x0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < search->n_attributes; lVar3 = lVar3 + 1) {
        free(*(void **)((long)&search->attributes->name + lVar2));
        free(*(void **)((long)&search->attributes->value + lVar2));
        lVar2 = lVar2 + 0x18;
      }
      free(search->attributes);
      search->n_attributes = 0;
      search->attributes = (XMLAttribute *)0x0;
    }
    if (search->text != (SXML_CHAR *)0x0) {
      free(search->text);
      search->text = (SXML_CHAR *)0x0;
    }
    if ((free_next != 0) && (search->next != (XMLSearch *)0x0)) {
      XMLSearch_free(search->next,1);
      free(search->next);
    }
    iVar1 = 1;
    search->tag = (SXML_CHAR *)0x0;
    search->attributes = (XMLAttribute *)0x0;
    search->n_attributes = 0;
    search->text = (SXML_CHAR *)0x0;
    search->next = (_XMLSearch *)0x0;
    search->prev = (_XMLSearch *)0x0;
    search->stop_at = (XMLNode *)0xffffffffffffffff;
    search->init_value = 0x19770522;
  }
  return iVar1;
}

Assistant:

int XMLSearch_free(XMLSearch* search, int free_next)
{
	int i;

	if (search == NULL || search->init_value != XML_INIT_DONE)
		return FALSE;

	if (search->tag != NULL) {
		__free(search->tag);
		search->tag = NULL;
	}

	if (search->attributes != NULL) {
		for (i = 0; i < search->n_attributes; i++) {
			if (search->attributes[i].name != NULL)
				__free(search->attributes[i].name);
			if (search->attributes[i].value != NULL)
				__free(search->attributes[i].value);
		}
		__free(search->attributes);
		search->n_attributes = 0;
		search->attributes = NULL;
	}

	if (search->text != NULL) {
		__free(search->text);
		search->text = NULL;
	}

	if (free_next && search->next != NULL) {
		(void)XMLSearch_free(search->next, TRUE);
		__free(search->next);
		search->next = NULL;
	}
	search->init_value = 0; /* Something not XML_INIT_DONE, otherwise we'll go into 'XMLSearch_free' again */
	(void)XMLSearch_init(search);

	return TRUE;
}